

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

QString * __thiscall QString::assign_helper(QString *this,char32_t *data,qsizetype len)

{
  char16_t **ppcVar1;
  Data *pDVar2;
  QArrayData *data_00;
  char16_t *pcVar3;
  qsizetype qVar4;
  QUtf32 *this_00;
  QChar *pQVar5;
  long lVar6;
  DataEndianness in_R9D;
  long in_FS_OFFSET;
  QByteArrayView in;
  State local_48;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar2 = (this->d).d;
  if (((pDVar2 == (Data *)0x0) || ((pDVar2->super_QArrayData).alloc < len * 2)) ||
     ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 1)) {
    fromUcs4((QString *)&local_48,data,len);
    data_00 = &((this->d).d)->super_QArrayData;
    pcVar3 = (this->d).ptr;
    (this->d).d = (Data *)local_48._0_8_;
    (this->d).ptr = (char16_t *)local_48.remainingChars;
    qVar4 = (this->d).size;
    (this->d).size = local_48.invalidChars;
    local_48._0_8_ = data_00;
    local_48.remainingChars = (qsizetype)pcVar3;
    local_48.invalidChars = qVar4;
    if (data_00 != (QArrayData *)0x0) {
      LOCK();
      (data_00->ref_)._q_value.super___atomic_base<int>._M_i =
           (data_00->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data_00->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data_00,2,0x10);
      }
    }
  }
  else {
    if (pDVar2 == (Data *)0x0) {
      lVar6 = 0;
    }
    else {
      lVar6 = (long)((long)(this->d).ptr -
                    ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >>
              1;
    }
    if (lVar6 != 0) {
      ppcVar1 = &(this->d).ptr;
      *ppcVar1 = *ppcVar1 + -lVar6;
    }
    this_00 = (QUtf32 *)(this->d).ptr;
    local_48._0_8_ = (QArrayData *)0x0;
    local_48.remainingChars = 0;
    local_48.invalidChars = 0;
    local_48.field_4.d[0] = (void *)0x0;
    local_48.field_4.d[1] = (void *)0x0;
    local_48.clearFn = (ClearDataFn)0x0;
    in.m_data = (storage_type *)&local_48;
    in.m_size = (qsizetype)data;
    pQVar5 = QUtf32::convertToUnicode(this_00,(QChar *)(len << 2),in,(State *)0x0,in_R9D);
    lVar6 = (long)pQVar5 - (long)this_00;
    (this->d).size = lVar6 >> 1;
    *(undefined2 *)((long)(this->d).ptr + lVar6) = 0;
    QStringConverterBase::State::clear(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QString &QString::assign_helper(const char32_t *data, qsizetype len)
{
    // worst case: each char32_t requires a surrogate pair, so
    const auto requiredCapacity = len * 2;
    if (requiredCapacity <= capacity() && isDetached()) {
        const auto offset = d.freeSpaceAtBegin();
        if (offset)
            d.setBegin(d.begin() - offset);
        auto begin = reinterpret_cast<QChar *>(d.begin());
        auto ba = QByteArrayView(reinterpret_cast<const std::byte*>(data), len * sizeof(char32_t));
        QStringConverter::State state;
        const auto end = QUtf32::convertToUnicode(begin, ba, &state, DetectEndianness);
        d.size = end - begin;
        d.data()[d.size] = u'\0';
    } else {
        *this = QString::fromUcs4(data, len);
    }
    return *this;
}